

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  string *psVar1;
  ostream *poVar2;
  string filename;
  cmGeneratedFileStream fout;
  string sStack_278;
  undefined1 local_258 [584];
  
  psVar1 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  std::__cxx11::string::string((string *)&sStack_278,(string *)psVar1);
  std::__cxx11::string::append((char *)&sStack_278);
  std::__cxx11::string::append((string *)&sStack_278);
  std::__cxx11::string::append((char *)&sStack_278);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_258,&sStack_278,false,None);
  if (((byte)(*(_func_int **)(local_258._0_8_ + -0x18))[(long)(local_258 + 0x20)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)local_258,"#Generated by ");
    psVar1 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)psVar1);
    std::operator<<(poVar2,", do not edit.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_258);
  std::__cxx11::string::~string((string *)&sStack_278);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateDummyKateProjectFile(
  const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/";
  filename += this->ProjectName;
  filename += ".kateproject";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}